

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<const_type_&,_const_convert_c_&>::streamReconstructedExpression
          (BinaryExpr<const_type_&,_const_convert_c_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  long *local_78 [2];
  long local_68 [2];
  ReusableStringStream local_58;
  string local_40;
  
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,Detail::unprintableString_abi_cxx11_,
             DAT_00231d50 + Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  ReusableStringStream::ReusableStringStream(&local_58);
  std::ostream::operator<<(local_58.m_oss,0);
  ReusableStringStream::str_abi_cxx11_(&local_40,&local_58);
  ReusableStringStream::~ReusableStringStream(&local_58);
  op.m_size = (size_type)&local_40;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_78,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }